

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

int32_t ucnv_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  uint32_t *__src;
  byte bVar1;
  UDataSwapFn *pUVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int32_t iVar13;
  size_t sVar14;
  ulong uVar15;
  uint32_t uVar16;
  void *pvVar17;
  byte *pbVar18;
  uint uVar19;
  uint uVar20;
  char *pcVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int local_a8;
  char local_9c;
  UDataSwapFn **local_70;
  ulong local_60;
  byte *local_40;
  
  iVar4 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar22 = *(byte *)((long)inData + 0xd);
  if ((((bVar22 != 0x6e || *(byte *)((long)inData + 0xc) != 99) ||
       (bVar22 = 0x6e, *(char *)((long)inData + 0xe) != 'v')) ||
      (*(char *)((long)inData + 0xf) != 't')) ||
     ((*(char *)((long)inData + 0x10) != '\x06' || (*(byte *)((long)inData + 0x11) < 2)))) {
    udata_printError_63(ds,
                        "ucnv_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as an ICU .cnv conversion table\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar22,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (ulong)*(byte *)((long)inData + 0x10),(ulong)*(byte *)((long)inData + 0x11))
    ;
    goto LAB_00161d56;
  }
  __src = (uint32_t *)((long)inData + (long)iVar4);
  pvVar17 = (void *)((long)iVar4 + (long)outData);
  if (-1 < length) {
    uVar24 = length - iVar4;
    if (99 < (int)uVar24) {
      uVar5 = (*ds->readUInt32)(*__src);
      length = uVar24 - uVar5;
      if (uVar5 <= uVar24) {
        if (inData != outData) {
          memcpy(pvVar17,__src,(ulong)uVar5);
        }
        (*ds->swapArray32)(ds,__src,4,pvVar17,pErrorCode);
        (*ds->swapArray32)(ds,__src + 0x10,4,(void *)((long)pvVar17 + 0x40),pErrorCode);
        pUVar2 = ds->swapInvChars;
        sVar14 = strlen((char *)(__src + 1));
        (*pUVar2)(ds,__src + 1,(int32_t)sVar14,(void *)((long)pvVar17 + 4),pErrorCode);
        if (U_ZERO_ERROR < *pErrorCode) {
          udata_printError_63(ds,"ucnv_swap(): error swapping converter name\n");
          return 0;
        }
        goto LAB_00161d7d;
      }
    }
    pcVar21 = "ucnv_swap(): too few bytes (%d after header) for an ICU .cnv conversion table\n";
    length = uVar24;
    goto LAB_00161d08;
  }
  uVar5 = (*ds->readUInt32)(*__src);
LAB_00161d7d:
  uVar24 = (uint)*(char *)((long)__src + 0x45);
  if (uVar24 != 2) {
    pcVar21 = "ucnv_swap(): unknown conversionType=%d!=UCNV_MBCS\n";
LAB_00161dad:
    udata_printError_63(ds,pcVar21,(ulong)uVar24);
    goto LAB_00161d56;
  }
  if ((uint)length < 0x28) {
LAB_00161d95:
    pcVar21 = 
    "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n";
LAB_00161d08:
    udata_printError_63(ds,pcVar21,(ulong)(uint)length);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  pbVar18 = (byte *)((long)__src + (ulong)uVar5);
  bVar22 = *pbVar18;
  uVar15 = (ulong)bVar22;
  if (bVar22 == 5) {
    uVar15 = 5;
    if (2 < pbVar18[1]) {
      uVar6 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 0x20));
      if ((uVar6 & 0xff80) == 0) {
        local_9c = (char)((uVar6 & 0x40) >> 6);
        local_60 = (ulong)((uVar6 & 0x3f) << 2);
        bVar22 = pbVar18[1];
        goto LAB_00161eff;
      }
      uVar15 = (ulong)*pbVar18;
    }
  }
  else if (bVar22 == 4) {
    bVar22 = pbVar18[1];
    if (bVar22 != 0) {
      local_60 = 0x20;
      local_9c = '\0';
LAB_00161eff:
      bVar1 = pbVar18[2];
      uVar6 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 4));
      uVar7 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 8));
      uVar8 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 0xc));
      uVar9 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 0x10));
      uVar10 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 0x14));
      uVar11 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 0x18));
      uVar12 = (*ds->readUInt32)(*(uint32_t *)(pbVar18 + 0x1c));
      if ((local_9c != '\0') && ((uVar11 & 0xff) == 0)) {
        udata_printError_63(ds,
                            "ucnv_swap(): unsupported combination of makeconv --small with SBCS\n");
        goto LAB_00161d56;
      }
      uVar24 = uVar11 & 0xff;
      if ((0xe < (byte)uVar11) || (uVar19 = uVar11 & 0xff, (0x530fU >> (uVar11 & 0x1f) & 1) == 0)) {
        pcVar21 = "ucnv_swap(): unsupported MBCS output type 0x%x\n";
        goto LAB_00161dad;
      }
      uVar20 = 0;
      if ((((2 < bVar22) && ((byte)uVar11 != 0)) && (uVar19 != 0xe)) && (bVar1 != 0)) {
        uVar20 = (uint)bVar1 * 0x100 + 0x100 >> 5;
      }
      uVar3 = uVar11 >> 8;
      uVar15 = (ulong)uVar3;
      if (uVar11 < 0x100) {
        local_40 = (byte *)0x0;
        uVar16 = uVar12;
        if (local_9c != '\0') {
          uVar16 = 0;
        }
        local_a8 = uVar16 + uVar10 + uVar20;
      }
      else {
        if ((-1 < length) && (length < (int)(uVar3 + 0x80))) {
          pcVar21 = 
          "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n"
          ;
          goto LAB_00161d08;
        }
        local_40 = pbVar18 + uVar15;
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(pbVar18 + uVar15 + 0x7c));
        local_a8 = iVar13 + uVar3;
      }
      if (length < 0) goto LAB_001624a6;
      if (length < local_a8) goto LAB_00161d95;
      pvVar17 = (void *)((long)pvVar17 + (ulong)uVar5);
      if (inData != outData) {
        memcpy(pvVar17,pbVar18,(long)local_a8);
      }
      (*ds->swapArray32)(ds,pbVar18 + 4,(uint)local_60 - 4,(void *)((long)pvVar17 + 4),pErrorCode);
      if (uVar24 == 0xe) {
        pUVar2 = ds->swapInvChars;
        sVar14 = strlen((char *)(pbVar18 + local_60));
        (*pUVar2)(ds,pbVar18 + local_60,(int32_t)sVar14,(void *)(local_60 + (long)pvVar17),
                  pErrorCode);
      }
      else {
        (*ds->swapArray32)(ds,pbVar18 + local_60,uVar6 << 10,(void *)(local_60 + (long)pvVar17),
                           pErrorCode);
        uVar25 = (ulong)(uVar6 << 10 | (uint)local_60);
        (*ds->swapArray32)(ds,pbVar18 + uVar25,uVar7 << 3,(void *)(uVar25 + (long)pvVar17),
                           pErrorCode);
        (*ds->swapArray16)(ds,pbVar18 + uVar8,uVar9 - uVar8,(void *)((ulong)uVar8 + (long)pvVar17),
                           pErrorCode);
        if (uVar24 == 0) {
          uVar20 = (uVar10 - uVar9) + uVar12;
        }
        else {
          local_70 = &ds->swapArray16;
          iVar23 = (*(byte *)((long)__src + 0x4f) & 1) * 0x800;
          (*ds->swapArray16)(ds,pbVar18 + uVar9,iVar23 + 0x80,(void *)((ulong)uVar9 + (long)pvVar17)
                             ,pErrorCode);
          uVar24 = iVar23 + uVar9 + 0x80;
          (*ds->swapArray32)(ds,pbVar18 + uVar24,uVar10 - uVar24,
                             (void *)((ulong)uVar24 + (long)pvVar17),pErrorCode);
          if (local_9c != '\0') {
            uVar12 = 0;
          }
          if (uVar19 < 8) {
            if (uVar19 != 1) {
              if (uVar19 != 3) goto LAB_001622a9;
              local_70 = &ds->swapArray32;
            }
LAB_00162286:
            (**local_70)(ds,pbVar18 + uVar10,uVar12,(void *)((ulong)uVar10 + (long)pvVar17),
                         pErrorCode);
          }
          else if ((uVar19 == 8) || (uVar19 == 0xc)) goto LAB_00162286;
LAB_001622a9:
          if (uVar20 == 0) goto LAB_001622d5;
          uVar9 = uVar12 + uVar10;
        }
        (*ds->swapArray16)(ds,pbVar18 + uVar9,uVar20,(void *)((ulong)uVar9 + (long)pvVar17),
                           pErrorCode);
      }
LAB_001622d5:
      if (0xff < uVar11) {
        pbVar18 = pbVar18 + uVar15;
        pvVar17 = (void *)((long)pvVar17 + uVar15);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 4));
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 8));
        (*ds->swapArray32)(ds,pbVar18 + uVar24,iVar13 * 4,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0xc));
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x10));
        (*ds->swapArray16)(ds,pbVar18 + uVar24,iVar13 * 2,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x14));
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x1c));
        (*ds->swapArray16)(ds,pbVar18 + uVar24,iVar13 * 2,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x18));
        (*ds->swapArray32)(ds,pbVar18 + uVar24,iVar13 << 2,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x28));
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x30));
        (*ds->swapArray16)(ds,pbVar18 + uVar24,iVar13 * 2,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x34));
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x38));
        (*ds->swapArray16)(ds,pbVar18 + uVar24,iVar13 * 2,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        uVar24 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x3c));
        iVar13 = udata_readInt32_63(ds,*(int32_t *)(local_40 + 0x40));
        (*ds->swapArray32)(ds,pbVar18 + uVar24,iVar13 * 4,(void *)((ulong)uVar24 + (long)pvVar17),
                           pErrorCode);
        iVar13 = udata_readInt32_63(ds,*(int32_t *)local_40);
        (*ds->swapArray32)(ds,pbVar18,iVar13 * 4,pvVar17,pErrorCode);
      }
LAB_001624a6:
      return uVar5 + iVar4 + local_a8;
    }
    uVar15 = 4;
  }
  udata_printError_63(ds,"ucnv_swap(): unsupported _MBCSHeader.version %d.%d\n",uVar15,
                      (ulong)pbVar18[1]);
LAB_00161d56:
  *pErrorCode = U_UNSUPPORTED_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    uint32_t offset, count, staticDataSize;
    int32_t size;

    const UConverterStaticData *inStaticData;
    UConverterStaticData *outStaticData;

    const _MBCSHeader *inMBCSHeader;
    _MBCSHeader *outMBCSHeader;
    _MBCSHeader mbcsHeader;
    uint32_t mbcsHeaderLength;
    UBool noFromU=FALSE;

    uint8_t outputType;

    int32_t maxFastUChar, mbcsIndexLength;

    const int32_t *inExtIndexes;
    int32_t extOffset;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x63 &&   /* dataFormat="cnvt" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x76 &&
        pInfo->dataFormat[3]==0x74 &&
        pInfo->formatVersion[0]==6 &&
        pInfo->formatVersion[1]>=2
    )) {
        udata_printError(ds, "ucnv_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as an ICU .cnv conversion table\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0], pInfo->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    /* read the initial UConverterStaticData structure after the UDataInfo header */
    inStaticData=(const UConverterStaticData *)inBytes;
    outStaticData=(UConverterStaticData *)outBytes;

    if(length<0) {
        staticDataSize=ds->readUInt32(inStaticData->structSize);
    } else {
        length-=headerSize;
        if( length<(int32_t)sizeof(UConverterStaticData) ||
            (uint32_t)length<(staticDataSize=ds->readUInt32(inStaticData->structSize))
        ) {
            udata_printError(ds, "ucnv_swap(): too few bytes (%d after header) for an ICU .cnv conversion table\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    if(length>=0) {
        /* swap the static data */
        if(inStaticData!=outStaticData) {
            uprv_memcpy(outStaticData, inStaticData, staticDataSize);
        }

        ds->swapArray32(ds, &inStaticData->structSize, 4,
                           &outStaticData->structSize, pErrorCode);
        ds->swapArray32(ds, &inStaticData->codepage, 4,
                           &outStaticData->codepage, pErrorCode);

        ds->swapInvChars(ds, inStaticData->name, (int32_t)uprv_strlen(inStaticData->name),
                            outStaticData->name, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ucnv_swap(): error swapping converter name\n");
            return 0;
        }
    }

    inBytes+=staticDataSize;
    outBytes+=staticDataSize;
    if(length>=0) {
        length-=(int32_t)staticDataSize;
    }

    /* check for supported conversionType values */
    if(inStaticData->conversionType==UCNV_MBCS) {
        /* swap MBCS data */
        inMBCSHeader=(const _MBCSHeader *)inBytes;
        outMBCSHeader=(_MBCSHeader *)outBytes;

        if(0<=length && length<(int32_t)sizeof(_MBCSHeader)) {
            udata_printError(ds, "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n",
                                length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        if(inMBCSHeader->version[0]==4 && inMBCSHeader->version[1]>=1) {
            mbcsHeaderLength=MBCS_HEADER_V4_LENGTH;
        } else if(inMBCSHeader->version[0]==5 && inMBCSHeader->version[1]>=3 &&
                  ((mbcsHeader.options=ds->readUInt32(inMBCSHeader->options))&
                   MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0
        ) {
            mbcsHeaderLength=mbcsHeader.options&MBCS_OPT_LENGTH_MASK;
            noFromU=(UBool)((mbcsHeader.options&MBCS_OPT_NO_FROM_U)!=0);
        } else {
            udata_printError(ds, "ucnv_swap(): unsupported _MBCSHeader.version %d.%d\n",
                             inMBCSHeader->version[0], inMBCSHeader->version[1]);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return 0;
        }

        uprv_memcpy(mbcsHeader.version, inMBCSHeader->version, 4);
        mbcsHeader.countStates=         ds->readUInt32(inMBCSHeader->countStates);
        mbcsHeader.countToUFallbacks=   ds->readUInt32(inMBCSHeader->countToUFallbacks);
        mbcsHeader.offsetToUCodeUnits=  ds->readUInt32(inMBCSHeader->offsetToUCodeUnits);
        mbcsHeader.offsetFromUTable=    ds->readUInt32(inMBCSHeader->offsetFromUTable);
        mbcsHeader.offsetFromUBytes=    ds->readUInt32(inMBCSHeader->offsetFromUBytes);
        mbcsHeader.flags=               ds->readUInt32(inMBCSHeader->flags);
        mbcsHeader.fromUBytesLength=    ds->readUInt32(inMBCSHeader->fromUBytesLength);
        /* mbcsHeader.options have been read above */

        extOffset=(int32_t)(mbcsHeader.flags>>8);
        outputType=(uint8_t)mbcsHeader.flags;
        if(noFromU && outputType==MBCS_OUTPUT_1) {
            udata_printError(ds, "ucnv_swap(): unsupported combination of makeconv --small with SBCS\n");
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return 0;
        }

        /* make sure that the output type is known */
        switch(outputType) {
        case MBCS_OUTPUT_1:
        case MBCS_OUTPUT_2:
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4:
        case MBCS_OUTPUT_3_EUC:
        case MBCS_OUTPUT_4_EUC:
        case MBCS_OUTPUT_2_SISO:
        case MBCS_OUTPUT_EXT_ONLY:
            /* OK */
            break;
        default:
            udata_printError(ds, "ucnv_swap(): unsupported MBCS output type 0x%x\n",
                             outputType);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return 0;
        }

        /* calculate the length of the MBCS data */

        /*
         * utf8Friendly MBCS files (mbcsHeader.version 4.3)
         * contain an additional mbcsIndex table:
         *   uint16_t[(maxFastUChar+1)>>6];
         * where maxFastUChar=((mbcsHeader.version[2]<<8)|0xff).
         */
        maxFastUChar=0;
        mbcsIndexLength=0;
        if( outputType!=MBCS_OUTPUT_EXT_ONLY && outputType!=MBCS_OUTPUT_1 &&
            mbcsHeader.version[1]>=3 && (maxFastUChar=mbcsHeader.version[2])!=0
        ) {
            maxFastUChar=(maxFastUChar<<8)|0xff;
            mbcsIndexLength=((maxFastUChar+1)>>6)*2;  /* number of bytes */
        }

        if(extOffset==0) {
            size=(int32_t)(mbcsHeader.offsetFromUBytes+mbcsIndexLength);
            if(!noFromU) {
                size+=(int32_t)mbcsHeader.fromUBytesLength;
            }

            /* avoid compiler warnings - not otherwise necessary, and the value does not matter */
            inExtIndexes=NULL;
        } else {
            /* there is extension data after the base data, see ucnv_ext.h */
            if(length>=0 && length<(extOffset+UCNV_EXT_INDEXES_MIN_LENGTH*4)) {
                udata_printError(ds, "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n",
                                 length);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            inExtIndexes=(const int32_t *)(inBytes+extOffset);
            size=extOffset+udata_readInt32(ds, inExtIndexes[UCNV_EXT_SIZE]);
        }

        if(length>=0) {
            if(length<size) {
                udata_printError(ds, "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n",
                                 length);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            /* copy the data for inaccessible bytes */
            if(inBytes!=outBytes) {
                uprv_memcpy(outBytes, inBytes, size);
            }

            /* swap the MBCSHeader, except for the version field */
            count=mbcsHeaderLength*4;
            ds->swapArray32(ds, &inMBCSHeader->countStates, count-4,
                               &outMBCSHeader->countStates, pErrorCode);

            if(outputType==MBCS_OUTPUT_EXT_ONLY) {
                /*
                 * extension-only file,
                 * contains a base name instead of normal base table data
                 */

                /* swap the base name, between the header and the extension data */
                const char *inBaseName=(const char *)inBytes+count;
                char *outBaseName=(char *)outBytes+count;
                ds->swapInvChars(ds, inBaseName, (int32_t)uprv_strlen(inBaseName),
                                    outBaseName, pErrorCode);
            } else {
                /* normal file with base table data */

                /* swap the state table, 1kB per state */
                offset=count;
                count=mbcsHeader.countStates*1024;
                ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                   outBytes+offset, pErrorCode);

                /* swap the toUFallbacks[] */
                offset+=count;
                count=mbcsHeader.countToUFallbacks*8;
                ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                   outBytes+offset, pErrorCode);

                /* swap the unicodeCodeUnits[] */
                offset=mbcsHeader.offsetToUCodeUnits;
                count=mbcsHeader.offsetFromUTable-offset;
                ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                   outBytes+offset, pErrorCode);

                /* offset to the stage 1 table, independent of the outputType */
                offset=mbcsHeader.offsetFromUTable;

                if(outputType==MBCS_OUTPUT_1) {
                    /* SBCS: swap the fromU tables, all 16 bits wide */
                    count=(mbcsHeader.offsetFromUBytes-offset)+mbcsHeader.fromUBytesLength;
                    ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                       outBytes+offset, pErrorCode);
                } else {
                    /* otherwise: swap the stage tables separately */

                    /* stage 1 table: uint16_t[0x440 or 0x40] */
                    if(inStaticData->unicodeMask&UCNV_HAS_SUPPLEMENTARY) {
                        count=0x440*2; /* for all of Unicode */
                    } else {
                        count=0x40*2; /* only BMP */
                    }
                    ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                       outBytes+offset, pErrorCode);

                    /* stage 2 table: uint32_t[] */
                    offset+=count;
                    count=mbcsHeader.offsetFromUBytes-offset;
                    ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                       outBytes+offset, pErrorCode);

                    /* stage 3/result bytes: sometimes uint16_t[] or uint32_t[] */
                    offset=mbcsHeader.offsetFromUBytes;
                    count= noFromU ? 0 : mbcsHeader.fromUBytesLength;
                    switch(outputType) {
                    case MBCS_OUTPUT_2:
                    case MBCS_OUTPUT_3_EUC:
                    case MBCS_OUTPUT_2_SISO:
                        ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                           outBytes+offset, pErrorCode);
                        break;
                    case MBCS_OUTPUT_4:
                        ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                           outBytes+offset, pErrorCode);
                        break;
                    default:
                        /* just uint8_t[], nothing to swap */
                        break;
                    }

                    if(mbcsIndexLength!=0) {
                        offset+=count;
                        count=mbcsIndexLength;
                        ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                           outBytes+offset, pErrorCode);
                    }
                }
            }

            if(extOffset!=0) {
                /* swap the extension data */
                inBytes+=extOffset;
                outBytes+=extOffset;

                /* swap toUTable[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_LENGTH]);
                ds->swapArray32(ds, inBytes+offset, length*4, outBytes+offset, pErrorCode);

                /* swap toUUChars[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_UCHARS_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_UCHARS_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUTableUChars[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_UCHARS_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUTableValues[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_VALUES_INDEX]);
                /* same length as for fromUTableUChars[] */
                ds->swapArray32(ds, inBytes+offset, length*4, outBytes+offset, pErrorCode);

                /* no need to swap fromUBytes[] */

                /* swap fromUStage12[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_12_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_12_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUStage3[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUStage3b[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3B_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3B_LENGTH]);
                ds->swapArray32(ds, inBytes+offset, length*4, outBytes+offset, pErrorCode);

                /* swap indexes[] */
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_INDEXES_LENGTH]);
                ds->swapArray32(ds, inBytes, length*4, outBytes, pErrorCode);
            }
        }
    } else {
        udata_printError(ds, "ucnv_swap(): unknown conversionType=%d!=UCNV_MBCS\n",
                         inStaticData->conversionType);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    return headerSize+(int32_t)staticDataSize+size;
}